

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

void secp256k1_modinv64(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  int iVar1;
  secp256k1_modinv64_trans2x2 *in_RSI;
  secp256k1_modinv64_signed62 *in_RDI;
  bool bVar2;
  secp256k1_modinv64_signed62 *unaff_retaddr;
  secp256k1_modinv64_trans2x2 t;
  int64_t zeta;
  int i;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 e;
  secp256k1_modinv64_signed62 d;
  int local_b4;
  undefined1 local_b0 [16];
  secp256k1_modinv64_modinfo *in_stack_ffffffffffffff60;
  int64_t in_stack_ffffffffffffff68;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffff70;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  secp256k1_modinv64_trans2x2 *in_stack_ffffffffffffff88;
  uint64_t in_stack_ffffffffffffff90;
  uint64_t in_stack_ffffffffffffff98;
  int64_t zeta_00;
  secp256k1_modinv64_trans2x2 *in_stack_ffffffffffffffb0;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffffb8;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffffc0;
  undefined1 local_38 [32];
  secp256k1_modinv64_modinfo *in_stack_ffffffffffffffe8;
  
  memset(local_38,0,0x28);
  memset(&stack0xffffffffffffffa0,0,0x28);
  zeta_00 = 1;
  memcpy(&stack0xffffffffffffff78,in_RSI,0x28);
  memcpy(local_b0,in_RDI,0x28);
  local_b4 = 0;
  while( true ) {
    if (9 < local_b4) {
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                         (int64_t)in_stack_ffffffffffffff70);
      if (iVar1 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
                ,0x26f,
                "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &SECP256K1_SIGNED62_ONE, 0) == 0"
               );
        abort();
      }
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                         (int64_t)in_stack_ffffffffffffff70);
      bVar2 = true;
      if (iVar1 != 0) {
        iVar1 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                           (int64_t)in_stack_ffffffffffffff70);
        bVar2 = true;
        if (iVar1 != 0) {
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                             in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                             (int64_t)in_stack_ffffffffffffff70);
          bVar2 = false;
          if (iVar1 == 0) {
            iVar1 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                               in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                               (int64_t)in_stack_ffffffffffffff70);
            bVar2 = false;
            if (iVar1 == 0) {
              iVar1 = secp256k1_modinv64_mul_cmp_62
                                ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                                 in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                                 (int64_t)in_stack_ffffffffffffff70);
              bVar2 = iVar1 == 0;
            }
          }
        }
      }
      if (bVar2) {
        secp256k1_modinv64_normalize_62
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        memcpy(in_RDI,local_38,0x28);
        return;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
              ,0x275,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, -1) == 0 || secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, 1) == 0 || (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 && secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 && secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) == 0)"
             );
      abort();
    }
    secp256k1_modinv64_divsteps_59
              (zeta_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
              );
    secp256k1_modinv64_update_de_62(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8);
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                       (int64_t)in_stack_ffffffffffffff70);
    if (iVar1 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
              ,0x25d,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                       (int64_t)in_stack_ffffffffffffff70);
    if (0 < iVar1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
              ,0x25e,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                       (int64_t)in_stack_ffffffffffffff70);
    if (iVar1 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
              ,0x25f,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                       (int64_t)in_stack_ffffffffffffff70);
    if (-1 < iVar1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
              ,0x260,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0"
             );
      abort();
    }
    secp256k1_modinv64_update_fg_62
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                       (int64_t)in_stack_ffffffffffffff70);
    if (iVar1 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
              ,0x264,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                       (int64_t)in_stack_ffffffffffffff70);
    if (0 < iVar1) break;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                       (int64_t)in_stack_ffffffffffffff70);
    if (iVar1 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
              ,0x266,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                       (int64_t)in_stack_ffffffffffffff70);
    if (-1 < iVar1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
              ,0x267,
              "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0"
             );
      abort();
    }
    local_b4 = local_b4 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
          ,0x265,
          "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0");
  abort();
}

Assistant:

static void secp256k1_modinv64(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int i;
    int64_t zeta = -1; /* zeta = -(delta+1/2); delta starts at 1/2. */

    /* Do 10 iterations of 59 divsteps each = 590 divsteps. This suffices for 256-bit inputs. */
    for (i = 0; i < 10; ++i) {
        /* Compute transition matrix and new zeta after 59 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        zeta = secp256k1_modinv64_divsteps_59(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv64_update_fg_62(&f, &g, &t);

        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, 5, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[4], modinfo);
    *x = d;
}